

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eimgfs.cpp
# Opt level: O0

ssize_t __thiscall B000FFReadWriter::write(B000FFReadWriter *this,int __fd,void *__buf,size_t __n)

{
  uint uVar1;
  uint uVar2;
  bool bVar3;
  uint32_t uVar4;
  pointer ppVar5;
  undefined8 *puVar6;
  uint *puVar7;
  unsigned_long *puVar8;
  element_type *peVar9;
  uint64_t uVar10;
  B000FFReadWriter *pBVar11;
  undefined4 in_register_00000034;
  unsigned_long local_68;
  unsigned_long local_60;
  size_t want;
  uint local_50;
  uint32_t local_4c;
  int n_1;
  uint32_t prevend;
  _Self local_40;
  uint local_34;
  iterator iStack_30;
  uint32_t nextstart;
  _Self local_28;
  B000FFReadWriter *local_20;
  size_t n_local;
  uint8_t *p_local;
  B000FFReadWriter *this_local;
  
  n_local = CONCAT44(in_register_00000034,__fd);
  pBVar11 = this;
  local_20 = (B000FFReadWriter *)__buf;
  p_local = (uint8_t *)this;
  while( true ) {
    if (local_20 == (B000FFReadWriter *)0x0) {
      return (ssize_t)pBVar11;
    }
    local_28._M_node =
         (_Base_ptr)
         std::
         map<unsigned_int,_B000FFReadWriter::blockinfo,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_B000FFReadWriter::blockinfo>_>_>
         ::end(&this->_blockmap);
    bVar3 = std::operator==(&this->_curblk,&local_28);
    if (bVar3) break;
    uVar1 = this->_bpos;
    ppVar5 = std::_Rb_tree_iterator<std::pair<const_unsigned_int,_B000FFReadWriter::blockinfo>_>::
             operator->(&this->_curblk);
    uVar4 = blockinfo::endblkofs(&ppVar5->second);
    if (uVar4 <= uVar1) {
      (*(this->super_ReadWriter)._vptr_ReadWriter[4])(this,(ulong)this->_bpos);
      iStack_30 = std::
                  map<unsigned_int,_B000FFReadWriter::blockinfo,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_B000FFReadWriter::blockinfo>_>_>
                  ::end(&this->_blockmap);
      bVar3 = std::operator==(&this->_curblk,&stack0xffffffffffffffd0);
      if (bVar3) {
        puVar6 = (undefined8 *)__cxa_allocate_exception(8);
        *puVar6 = "b000ff: out of space";
        __cxa_throw(puVar6,&char_const*::typeinfo,0);
      }
    }
    uVar1 = this->_bpos;
    ppVar5 = std::_Rb_tree_iterator<std::pair<const_unsigned_int,_B000FFReadWriter::blockinfo>_>::
             operator->(&this->_curblk);
    if (uVar1 < (ppVar5->second).blockofs) {
      ppVar5 = std::_Rb_tree_iterator<std::pair<const_unsigned_int,_B000FFReadWriter::blockinfo>_>::
               operator->(&this->_curblk);
      uVar1 = (ppVar5->second).blockofs;
      local_34 = uVar1;
      if (1 < g_verbose) {
        uVar2 = this->_bpos;
        ppVar5 = std::_Rb_tree_iterator<std::pair<const_unsigned_int,_B000FFReadWriter::blockinfo>_>
                 ::operator->(&this->_curblk);
        uVar4 = blockinfo::endblkofs(&ppVar5->second);
        printf("attempted write in b00 gap: %08x [ nextbk=%08x-%08x]\n",(ulong)uVar2,(ulong)uVar1,
               (ulong)uVar4);
      }
      local_40._M_node =
           (_Base_ptr)
           std::
           map<unsigned_int,_B000FFReadWriter::blockinfo,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_B000FFReadWriter::blockinfo>_>_>
           ::begin(&this->_blockmap);
      bVar3 = std::operator==(&this->_curblk,&local_40);
      if (bVar3) {
        puVar6 = (undefined8 *)__cxa_allocate_exception(8);
        *puVar6 = "b000ff: can\'t write before first block";
        __cxa_throw(puVar6,&char_const*::typeinfo,0);
      }
      _n_1 = std::_Rb_tree_iterator<std::pair<const_unsigned_int,_B000FFReadWriter::blockinfo>_>::
             operator--(&this->_curblk,0);
      ppVar5 = std::_Rb_tree_iterator<std::pair<const_unsigned_int,_B000FFReadWriter::blockinfo>_>::
               operator->(&this->_curblk);
      local_4c = blockinfo::endblkofs(&ppVar5->second);
      local_50 = (this->_bpos - local_4c) / this->_blocksize;
      uVar4 = local_4c + local_50 * this->_blocksize;
      want._4_4_ = (local_34 - local_4c) + local_50 * this->_blocksize;
      puVar7 = std::min<unsigned_int>(&this->_blocksize,(uint *)((long)&want + 4));
      allocblock(this,uVar4,*puVar7);
      (*(this->super_ReadWriter)._vptr_ReadWriter[4])(this,(ulong)this->_bpos);
    }
    ppVar5 = std::_Rb_tree_iterator<std::pair<const_unsigned_int,_B000FFReadWriter::blockinfo>_>::
             operator->(&this->_curblk);
    (ppVar5->second).modified = true;
    ppVar5 = std::_Rb_tree_iterator<std::pair<const_unsigned_int,_B000FFReadWriter::blockinfo>_>::
             operator->(&this->_curblk);
    uVar1 = (ppVar5->second).size;
    uVar4 = this->_bpos;
    ppVar5 = std::_Rb_tree_iterator<std::pair<const_unsigned_int,_B000FFReadWriter::blockinfo>_>::
             operator->(&this->_curblk);
    local_68 = (ulong)uVar1 - (ulong)(uVar4 - (ppVar5->second).blockofs);
    puVar8 = std::min<unsigned_long>((unsigned_long *)&local_20,&local_68);
    local_60 = *puVar8;
    peVar9 = std::__shared_ptr_access<ReadWriter,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<ReadWriter,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                        )&this->_r);
    ppVar5 = std::_Rb_tree_iterator<std::pair<const_unsigned_int,_B000FFReadWriter::blockinfo>_>::
             operator->(&this->_curblk);
    uVar10 = blockinfo::block2file(&ppVar5->second,this->_bpos);
    (*peVar9->_vptr_ReadWriter[4])(peVar9,uVar10);
    peVar9 = std::__shared_ptr_access<ReadWriter,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<ReadWriter,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                        )&this->_r);
    (*peVar9->_vptr_ReadWriter[3])(peVar9,n_local,local_60);
    this->_bpos = this->_bpos + (int)local_60;
    pBVar11 = (B000FFReadWriter *)((long)local_20 - local_60);
    local_20 = pBVar11;
  }
  puVar6 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar6 = "b000ff: out of space";
  __cxa_throw(puVar6,&char_const*::typeinfo,0);
}

Assistant:

virtual void write(const uint8_t *p, size_t n)
    {
        while (n) {
            if (_curblk==_blockmap.end())
                throw "b000ff: out of space";

            // cur pos is after cur block -> move to next
            if (_bpos >= _curblk->second.endblkofs()) {
                setpos(_bpos);

                if (_curblk==_blockmap.end())
                    throw "b000ff: out of space";
            }

            // cur pos is before current block ( and after prev block )
            if (_bpos < _curblk->second.blockofs) {
                uint32_t nextstart= _curblk->second.blockofs;

                if (g_verbose>1)
                    printf("attempted write in b00 gap: %08x [ nextbk=%08x-%08x]\n", _bpos, nextstart, _curblk->second.endblkofs());

                if (_curblk==_blockmap.begin())
                    throw "b000ff: can't write before first block";

                _curblk--;
                uint32_t prevend= _curblk->second.endblkofs();
                int n= (_bpos-prevend)/_blocksize;
    
//              printf("alloccing b00 block: prev=%08x, next=%08x -> n=%d: ofs=%08x, size=%08x\n", 
//                      prevend, nextstart, n, prevend+n*_blocksize, std::min(_blocksize, nextstart-prevend+n*_blocksize));
                allocblock(prevend+n*_blocksize, std::min(_blocksize, nextstart-prevend+n*_blocksize));
                setpos(_bpos);
            }

            _curblk->second.modified= true;

            size_t want= std::min(n, _curblk->second.size-size_t(_bpos-_curblk->second.blockofs));

            _r->setpos(_curblk->second.block2file(_bpos));
            _r->write(p, want);

            _bpos += want;
            n -= want;
        }
    }